

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O1

bool __thiscall LinearSystem::RunDirectGauss(LinearSystem *this,ChoiceType choice_type)

{
  ExtendedMatrix *this_00;
  pointer pOVar1;
  int iVar2;
  int row;
  bool bVar3;
  Fraction *pFVar4;
  Fraction FVar5;
  Fraction *b;
  int pos;
  Fraction coefficient;
  int local_44;
  vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_> *local_40;
  Fraction local_38;
  
  this->rank_ = 0;
  iVar2 = this->n_;
  if (this->m_ < this->n_) {
    iVar2 = this->m_;
  }
  if (0 < iVar2) {
    this_00 = &this->system_;
    local_40 = &this->history_;
    pos = 0;
    do {
      bVar3 = Choice(this,pos,choice_type);
      if ((bVar3) || (bVar3 = Choice(this,pos,Column), bVar3)) {
        this->rank_ = this->rank_ + 1;
        local_44 = 1;
        pFVar4 = ExtendedMatrix::At(this_00,pos,pos);
        FVar5 = operator/(&local_44,pFVar4);
        PerformOperation(this,MultiplyRow,pos,0,FVar5);
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        row = pos;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(local_40);
        }
        while (row = row + 1, row < this->n_) {
          pFVar4 = ExtendedMatrix::At(this_00,row,pos);
          b = ExtendedMatrix::At(this_00,pos,pos);
          local_38 = operator/(pFVar4,b);
          FVar5 = Fraction::operator-(&local_38);
          PerformOperation(this,AddRow,row,pos,FVar5);
        }
        pOVar1 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((this->history_).
             super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
             _M_impl.super__Vector_impl_data._M_start != pOVar1) &&
           (pOVar1[-1].operation_type != MainOutput)) {
          std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::
          emplace_back<>(local_40);
        }
      }
      pos = pos + 1;
    } while (pos != iVar2);
  }
  this->rank_ = this->n_;
  return this->n_ != 0;
}

Assistant:

bool LinearSystem::RunDirectGauss(Options::ChoiceType choice_type) {
  rank_ = 0;

  int max_pos = std::min(n_, m_);
  for (int pos = 0; pos < max_pos; ++pos) {
    if (!Choice(pos, choice_type) && !Choice(pos)) {
      continue;
    }

    ++rank_;

    PerformOperation(OperationType::MultiplyRow, pos, 0, 1 / system_.At(pos, pos));
    AddMainOutput();

    for (int row = pos + 1; row < n_; ++row) {
      Fraction coefficient = system_.At(row, pos) / system_.At(pos, pos);
      PerformOperation(OperationType::AddRow, row, pos, -coefficient);
    }

    AddMainOutput();
  }

  return rank_ = n_;
}